

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O1

void __thiscall
HSimplexNla::reportArraySparse
          (HSimplexNla *this,string *message,HighsInt offset,HVector *vector,bool force)

{
  uint uVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> sorted_index;
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  string local_50;
  
  if ((force | this->report_) != 1) {
    return;
  }
  uVar1 = this->lp_->num_row_;
  if (vector->count < 0x1a) {
    if ((int)uVar1 <= vector->count) {
      iVar5 = 0;
      printf("%s",(message->_M_dataplus)._M_p);
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          if ((int)((uVar4 & 0xffffffff) / 5) * 5 + iVar5 == 0) {
            putchar(10);
          }
          printf("%11.4g ",
                 (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4]);
          uVar4 = uVar4 + 1;
          iVar5 = iVar5 + -1;
        } while (uVar1 != uVar4);
      }
      goto LAB_0036a9b7;
    }
    std::vector<int,_std::allocator<int>_>::vector(&local_88,&vector->index);
    uVar4 = (ulong)vector->count;
    if (uVar4 != 0) {
      iVar5 = 0;
      lVar3 = uVar4 * 4;
      if (vector->count != 1) {
        iVar5 = 0;
        do {
          uVar4 = (long)uVar4 >> 1;
          iVar5 = iVar5 + 1;
        } while (1 < uVar4);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
                (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (undefined1 *)
                 ((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar3),iVar5,1);
    }
    printf("%s",(message->_M_dataplus)._M_p);
    if (0 < vector->count) {
      uVar4 = 0;
      do {
        uVar1 = *(uint *)((long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + uVar4 * 4);
        if ((int)uVar4 == (int)((uVar4 & 0xffffffff) / 5) * 5) {
          putchar(10);
        }
        printf("[%4d ",(ulong)uVar1);
        if (offset != 0) {
          printf("(%4d)",(ulong)(offset + uVar1));
        }
        printf("%11.4g] ",
               (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar1]);
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)vector->count);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0036a9b7;
  }
  else {
    pcVar2 = (message->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + message->_M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Unknown","");
    analyseVectorValues((HighsLogOptions *)0x0,&local_50,uVar1,&vector->array,true,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0036a9b7;
  }
  operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_0036a9b7:
  putchar(10);
  return;
}

Assistant:

void HSimplexNla::reportArraySparse(const std::string message,
                                    const HighsInt offset,
                                    const HVector* vector,
                                    const bool force) const {
  if (!report_ && !force) return;
  const HighsInt num_row = lp_->num_row_;
  if (vector->count > kReportItemLimit) {
    analyseVectorValues(nullptr, message, num_row, vector->array, true);
  } else if (vector->count < num_row) {
    std::vector<HighsInt> sorted_index = vector->index;
    pdqsort(sorted_index.begin(), sorted_index.begin() + vector->count);
    printf("%s", message.c_str());
    for (HighsInt en = 0; en < vector->count; en++) {
      HighsInt iRow = sorted_index[en];
      if (en % 5 == 0) printf("\n");
      printf("[%4d ", (int)(iRow));
      if (offset) printf("(%4d)", (int)(offset + iRow));
      printf("%11.4g] ", vector->array[iRow]);
    }
  } else {
    if (num_row > kReportItemLimit) {
      analyseVectorValues(nullptr, message, num_row, vector->array, true);
      return;
    }
    printf("%s", message.c_str());
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow % 5 == 0) printf("\n");
      printf("%11.4g ", vector->array[iRow]);
    }
  }
  printf("\n");
}